

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O1

int ravi_compile_n(lua_State *L)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  lua_Integer *in_RCX;
  ulong uVar4;
  lua_Integer in_R8;
  lua_Integer ival;
  Proto *functions [100];
  ravi_compile_options_t local_348;
  int local_340 [2];
  Proto *local_338 [100];
  
  iVar1 = lua_type(L,1);
  if (iVar1 == 5) {
    lua_pushnil(L);
    iVar2 = lua_next(L,1);
    iVar1 = 0;
    while (iVar2 != 0) {
      if (iVar1 < 100) {
        iVar2 = lua_type(L,-1);
        if (iVar2 == 6) {
          iVar2 = lua_iscfunction(L,-1);
          if (iVar2 == 0) {
            pvVar3 = lua_topointer(L,-1);
            if (((*(Proto **)((long)pvVar3 + 0x18))->ravi_jit).jit_function == (lua_CFunction)0x0) {
              in_RCX = (lua_Integer *)(long)iVar1;
              iVar1 = iVar1 + 1;
              local_338[(long)in_RCX] = *(Proto **)((long)pvVar3 + 0x18);
            }
          }
        }
      }
      lua_settop(L,-2);
      iVar2 = lua_next(L,1);
    }
    goto LAB_0014998e;
  }
  iVar1 = lua_type(L,1);
  if (iVar1 == 6) {
    iVar1 = lua_iscfunction(L,1);
    if (iVar1 != 0) goto LAB_0014995f;
  }
  else {
LAB_0014995f:
    luaL_argerror(L,1,"argument must be a Lua function");
  }
  iVar1 = 1;
  pvVar3 = lua_topointer(L,1);
  local_338[0] = *(Proto **)((long)pvVar3 + 0x18);
LAB_0014998e:
  local_348._0_1_ = 7;
  local_348._1_3_ = 0;
  local_348.codegen_type = RAVI_CODEGEN_NONE;
  iVar2 = lua_type(L,2);
  if (iVar2 == 5) {
    l_table_get_integer(L,0x165b78,(char *)local_340,in_RCX,in_R8);
    uVar4 = CONCAT71((int7)((ulong)in_RCX >> 8),local_348._0_1_) & 0xfffffffffffffffd;
    local_348._0_1_ = (byte)uVar4 | (local_340[0] != 0) * '\x02';
    l_table_get_integer(L,0x165b8f,(char *)local_340,
                        (lua_Integer *)CONCAT71((int7)(uVar4 >> 8),local_348._0_1_),in_R8);
    local_348._0_1_ = local_348._0_1_ & 0xfb | (local_340[0] != 0) << 2;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  else {
    iVar1 = raviV_compile_n(L,local_338,iVar1,&local_348);
  }
  lua_pushboolean(L,iVar1);
  return 1;
}

Assistant:

static int ravi_compile_n(lua_State *L) {
  enum { MAX_COMPILES = 100 };
  Proto *functions[MAX_COMPILES];
  int n = 0;
  if (lua_istable(L, 1)) {
    lua_pushnil(L);  // push first key
    while (lua_next(L, 1)) {
      if (n < MAX_COMPILES && lua_isfunction(L, -1) &&
          !lua_iscfunction(L, -1)) {
        void *p = (void *)lua_topointer(L, -1);
        LClosure *l = (LClosure *)(p);
        if (!l->p->ravi_jit.jit_function) functions[n++] = l->p;
      }
      lua_pop(L, 1);  // pop value, but keep key
    }
  }
  else {
    luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1), 1,
                  "argument must be a Lua function");
    void *p = (void *)lua_topointer(L, 1);
    LClosure *l = (LClosure *)(p);
    functions[n++] = l->p;
  }
  ravi_compile_options_t options = {0, 0, 0, RAVI_CODEGEN_NONE};
  options.manual_request = 1;
  options.inline_lua_arithmetic_operators = 1;
  options.omit_array_get_range_check = 1;
  if (lua_istable(L, 2)) {
    lua_Integer ival;
    l_table_get_integer(L, 2, "omitArrayGetRangeCheck",
                        &ival, 0);
    options.omit_array_get_range_check = (int)ival ? 1 : 0;
    l_table_get_integer(L, 2, "inlineLuaArithmeticOperators",
                        &ival, 0);
    options.inline_lua_arithmetic_operators = (int)ival ? 1 : 0;
  }
  int result = 0;
  if (n > 0) { result = raviV_compile_n(L, functions, n, &options); }
  lua_pushboolean(L, result);
  return 1;
}